

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal-array.h
# Opt level: O1

void __thiscall
dynamicgraph::SignalArray_const<int>::SignalArray_const
          (SignalArray_const<int> *this,SignalBase<int> *sig)

{
  value_type *__val;
  pointer __s;
  
  this->_vptr_SignalArray_const = (_func_int **)&PTR__SignalArray_const_001278a0;
  (this->const_array).
  super__Vector_base<const_dynamicgraph::SignalBase<int>_*,_std::allocator<const_dynamicgraph::SignalBase<int>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->const_array).
  super__Vector_base<const_dynamicgraph::SignalBase<int>_*,_std::allocator<const_dynamicgraph::SignalBase<int>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->const_array).
  super__Vector_base<const_dynamicgraph::SignalBase<int>_*,_std::allocator<const_dynamicgraph::SignalBase<int>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __s = (pointer)operator_new(0xa0);
  (this->const_array).
  super__Vector_base<const_dynamicgraph::SignalBase<int>_*,_std::allocator<const_dynamicgraph::SignalBase<int>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = __s;
  (this->const_array).
  super__Vector_base<const_dynamicgraph::SignalBase<int>_*,_std::allocator<const_dynamicgraph::SignalBase<int>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = __s;
  (this->const_array).
  super__Vector_base<const_dynamicgraph::SignalBase<int>_*,_std::allocator<const_dynamicgraph::SignalBase<int>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = __s + 0x14;
  memset(__s,0,0xa0);
  (this->const_array).
  super__Vector_base<const_dynamicgraph::SignalBase<int>_*,_std::allocator<const_dynamicgraph::SignalBase<int>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = __s + 0x14;
  this->size = 0x14;
  this->rank = 0;
  addElmt(this,sig);
  return;
}

Assistant:

SignalArray_const<Time>(const SignalBase<Time> &sig)
      : const_array(DEFAULT_SIZE), size(DEFAULT_SIZE), rank(0) {
    addElmt(&sig);
  }